

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  BYTE *pBVar1;
  void *iend;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  ushort uVar9;
  U32 UVar10;
  uint uVar11;
  size_t err_code;
  size_t sVar12;
  XXH64_state_t *pXVar13;
  XXH64_state_t *pXVar14;
  unsigned_long_long uVar15;
  short sVar16;
  ulong uVar17;
  uint uVar18;
  XXH64_state_t *pXVar19;
  BYTE *ip;
  XXH64_state_t *srcSize_00;
  size_t err_code_1;
  XXH64_state_t *pXVar20;
  bool bVar21;
  ushort *local_88;
  
  if (cctx->stage == ZSTDcs_created) {
    pXVar13 = (XXH64_state_t *)0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      sVar12 = ZSTD_writeFrameHeader
                         (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                          cctx->dictID);
      if (0xffffffffffffff88 < sVar12) {
        return sVar12;
      }
      bVar21 = dstCapacity < sVar12;
      dstCapacity = dstCapacity - sVar12;
      if (bVar21) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x34e1,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      dst = (void *)((long)dst + sVar12);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar12 = 0;
    }
    if (srcSize == 0) {
      return sVar12;
    }
    pBVar5 = (cctx->blockState).matchState.window.base;
    if (pBVar5 == (BYTE *)0x0) {
LAB_00151c49:
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
    }
    if ((cctx->blockState).matchState.window.dictBase == (BYTE *)0x0) {
LAB_00151c68:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
    }
    ms = &(cctx->blockState).matchState;
    pBVar6 = (ms->window).nextSrc;
    if (pBVar6 != (BYTE *)src) {
      uVar17 = (long)pBVar6 - (long)pBVar5;
      UVar2 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = UVar2;
      if (uVar17 >> 0x20 != 0) goto LAB_00151cc5;
      UVar10 = (U32)uVar17;
      (cctx->blockState).matchState.window.dictLimit = UVar10;
      (cctx->blockState).matchState.window.dictBase = pBVar5;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar17);
      if (UVar10 - UVar2 < 8) {
        (cctx->blockState).matchState.window.lowLimit = UVar10;
      }
    }
    pBVar5 = (BYTE *)((long)src + srcSize);
    (cctx->blockState).matchState.window.nextSrc = pBVar5;
    pBVar7 = (cctx->blockState).matchState.window.dictBase;
    uVar3 = (cctx->blockState).matchState.window.dictLimit;
    pBVar1 = pBVar7 + uVar3;
    pXVar19 = (XXH64_state_t *)
              CONCAT71((int7)((ulong)pBVar1 >> 8),
                       pBVar1 <= src ||
                       pBVar5 <= pBVar7 + (cctx->blockState).matchState.window.lowLimit);
    if (pBVar1 > src && pBVar5 > pBVar7 + (cctx->blockState).matchState.window.lowLimit) {
      uVar18 = (uint)((long)pBVar5 - (long)pBVar7);
      if ((long)(ulong)uVar3 < (long)pBVar5 - (long)pBVar7) {
        uVar18 = uVar3;
      }
      (cctx->blockState).matchState.window.lowLimit = uVar18;
    }
    if (pBVar6 != (BYTE *)src) {
      (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
    }
    if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
      pBVar6 = (cctx->ldmState).window.base;
      if (pBVar6 == (BYTE *)0x0) goto LAB_00151c49;
      if ((cctx->ldmState).window.dictBase == (BYTE *)0x0) goto LAB_00151c68;
      pBVar1 = (cctx->ldmState).window.nextSrc;
      if (pBVar1 != (BYTE *)src) {
        uVar17 = (long)pBVar1 - (long)pBVar6;
        UVar2 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = UVar2;
        if (uVar17 >> 0x20 != 0) {
LAB_00151cc5:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
        }
        UVar10 = (U32)uVar17;
        (cctx->ldmState).window.dictLimit = UVar10;
        (cctx->ldmState).window.dictBase = pBVar6;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar17);
        if (UVar10 - UVar2 < 8) {
          (cctx->ldmState).window.lowLimit = UVar10;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar5;
      pBVar6 = (cctx->ldmState).window.dictBase;
      uVar3 = (cctx->ldmState).window.dictLimit;
      if (src < pBVar6 + uVar3 && pBVar6 + (cctx->ldmState).window.lowLimit < pBVar5) {
        uVar18 = (uint)((long)pBVar5 - (long)pBVar6);
        if ((long)(ulong)uVar3 < (long)pBVar5 - (long)pBVar6) {
          uVar18 = uVar3;
        }
        (cctx->ldmState).window.lowLimit = uVar18;
      }
    }
    if (frame == 0) {
      ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar5);
      pXVar13 = (XXH64_state_t *)ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
    }
    else {
      uVar3 = (cctx->appliedParams).cParams.windowLog;
      if (0x1f < uVar3) {
        __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x344a,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      srcSize_00 = (XXH64_state_t *)cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        pXVar19 = &cctx->xxhState;
        ZSTD_XXH64_update(pXVar19,src,srcSize);
      }
      pXVar20 = (XXH64_state_t *)srcSize;
      local_88 = (ushort *)dst;
      do {
        if (pXVar20 == (XXH64_state_t *)0x0) {
          if ((lastFrameChunk != 0) && (dst < local_88)) {
            cctx->stage = ZSTDcs_ending;
          }
          pXVar13 = (XXH64_state_t *)((long)local_88 - (long)dst);
          break;
        }
        bVar21 = false;
        uVar18 = lastFrameChunk & 1;
        if (srcSize_00 < pXVar20) {
          uVar18 = 0;
        }
        if (dstCapacity < (undefined1 *)0x6) {
          pXVar13 = (XXH64_state_t *)0xffffffffffffffba;
        }
        else {
          if (pXVar20 < srcSize_00) {
            srcSize_00 = pXVar20;
          }
          iend = (void *)((long)src + (long)srcSize_00);
          ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,iend);
          uVar11 = (int)iend - *(int *)&(cctx->blockState).matchState.window.base;
          uVar4 = (cctx->blockState).matchState.loadedDictEnd;
          if (uVar11 < uVar4) {
            __assert_fail("blockEndIdx >= loadedDictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x21fe,
                          "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                         );
          }
          if (uVar4 + (1 << ((byte)uVar3 & 0x1f)) < uVar11) {
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar4 = (cctx->blockState).matchState.window.lowLimit;
          if ((cctx->blockState).matchState.nextToUpdate < uVar4) {
            (cctx->blockState).matchState.nextToUpdate = uVar4;
          }
          uVar9 = (ushort)uVar18;
          if ((cctx->appliedParams).targetCBlockSize == 0) {
            pXVar13 = (XXH64_state_t *)
                      ZSTD_compressBlock_internal
                                (cctx,(void *)((long)local_88 + 3),(size_t)(dstCapacity + -3),src,
                                 (size_t)srcSize_00,1);
            if ((XXH64_state_t *)0xffffffffffffff88 < pXVar13) goto LAB_00151a92;
            if (pXVar13 == (XXH64_state_t *)0x1) {
              sVar16 = 2;
              pXVar14 = srcSize_00;
            }
            else {
              if (pXVar13 == (XXH64_state_t *)0x0) {
                pXVar14 = (XXH64_state_t *)((long)&srcSize_00->total_len + 3);
                pXVar13 = (XXH64_state_t *)0xffffffffffffffba;
                if (pXVar14 <= dstCapacity) {
                  *local_88 = uVar9 + (short)srcSize_00 * 8;
                  *(char *)(local_88 + 1) = (char)((ulong)srcSize_00 >> 0xd);
                  memcpy((void *)((long)local_88 + 3),src,(size_t)srcSize_00);
                  pXVar13 = pXVar14;
                }
                if ((XXH64_state_t *)0xffffffffffffff88 < pXVar13) goto LAB_00151a92;
                goto LAB_00151ac6;
              }
              sVar16 = 4;
              pXVar14 = pXVar13;
            }
            *local_88 = sVar16 + (short)pXVar14 * 8 | uVar9;
            *(char *)(local_88 + 1) = (char)((ulong)pXVar14 >> 0xd);
            pXVar13 = (XXH64_state_t *)((long)&pXVar13->total_len + 3);
          }
          else {
            pXVar13 = (XXH64_state_t *)ZSTD_buildSeqStore(cctx,src,(size_t)srcSize_00);
            if (pXVar13 < (XXH64_state_t *)0xffffffffffffff89) {
              if ((pXVar13 == (XXH64_state_t *)0x0) &&
                 (pXVar13 = (XXH64_state_t *)
                            ZSTD_compressSuperBlock(cctx,local_88,dstCapacity,uVar18),
                 pXVar13 != (XXH64_state_t *)0xffffffffffffffba)) {
                if (pXVar13 < (XXH64_state_t *)0xffffffffffffff89) {
                  if ((pXVar13 == (XXH64_state_t *)0x0) ||
                     ((undefined1 *)((long)&srcSize_00->total_len + 3U) <= pXVar13))
                  goto LAB_0015194c;
                  pZVar8 = (cctx->blockState).prevCBlock;
                  (cctx->blockState).prevCBlock = (cctx->blockState).nextCBlock;
                  (cctx->blockState).nextCBlock = pZVar8;
                }
              }
              else {
LAB_0015194c:
                pXVar14 = (XXH64_state_t *)((long)&srcSize_00->total_len + 3);
                pXVar13 = (XXH64_state_t *)0xffffffffffffffba;
                if (pXVar14 <= dstCapacity) {
                  *local_88 = uVar9 + (short)srcSize_00 * 8;
                  *(char *)(local_88 + 1) = (char)((ulong)srcSize_00 >> 0xd);
                  memcpy((void *)((long)local_88 + 3),src,(size_t)srcSize_00);
                  pXVar13 = pXVar14;
                }
              }
              if ((pXVar13 < (XXH64_state_t *)0xffffffffffffff89) &&
                 (pZVar8 = (cctx->blockState).prevCBlock,
                 (pZVar8->entropy).fse.offcode_repeatMode == FSE_repeat_valid)) {
                (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
            }
            if ((XXH64_state_t *)0xffffffffffffff88 < pXVar13) {
LAB_00151a92:
              bVar21 = false;
              goto LAB_00151aee;
            }
            if (pXVar13 == (XXH64_state_t *)0x0) {
              __assert_fail("cSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3464,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            if ((undefined1 *)((long)&srcSize_00->total_len + 3U) < pXVar13) {
              __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3465,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
          }
LAB_00151ac6:
          bVar21 = dstCapacity < pXVar13;
          dstCapacity = dstCapacity + -(long)pXVar13;
          if (bVar21) {
            __assert_fail("dstCapacity >= cSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x347d,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
          local_88 = (ushort *)((long)local_88 + (long)pXVar13);
          pXVar20 = (XXH64_state_t *)((long)pXVar20 - (long)srcSize_00);
          cctx->isFirstBlock = 0;
          bVar21 = true;
          pXVar13 = pXVar19;
          src = iend;
        }
LAB_00151aee:
        pXVar19 = pXVar13;
      } while (bVar21);
    }
    if (pXVar13 < (XXH64_state_t *)0xffffffffffffff89) {
      uVar15 = srcSize + cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar15;
      pXVar19 = (XXH64_state_t *)(sVar12 + 0x28 + (long)(pXVar13->mem64 + -10));
      cctx->producedCSize = (long)pXVar19->mem64 + (cctx->producedCSize - 0x28);
      if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0)
         ) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x34fe,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      pXVar13 = (XXH64_state_t *)0xffffffffffffffb8;
      if (uVar15 + 1 <= cctx->pledgedSrcSizePlusOne) {
        pXVar13 = pXVar19;
      }
      if (cctx->pledgedSrcSizePlusOne == 0) {
        pXVar13 = pXVar19;
      }
    }
  }
  return (size_t)pXVar13;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize);
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize);
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}